

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ListBoxHeader(char *label,ImVec2 *size_arg)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  ImGuiContext *g;
  uint uVar4;
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  float fVar10;
  float local_88;
  float fStack_84;
  float local_68;
  float fStack_64;
  ImVec2 local_58;
  ImRect bb;
  ImRect local_40;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    id = GetID(label);
    IVar7 = CalcTextSize(label,(char *)0x0,true,-1.0);
    IVar9 = *size_arg;
    fVar5 = CalcItemWidth();
    fVar6 = GetTextLineHeightWithSpacing();
    IVar8 = CalcItemSize(IVar9,fVar5,fVar6 * 7.4 + (pIVar2->Style).ItemSpacing.y);
    local_68 = IVar7.x;
    fStack_64 = IVar7.y;
    uVar4 = -(uint)(fStack_64 <= IVar8.y);
    IVar7 = (pIVar1->DC).CursorPos;
    fVar5 = 0.0;
    IVar9 = (pIVar1->DC).CursorPos;
    fVar6 = IVar8.x + IVar9.x;
    fVar10 = (float)(uVar4 & (uint)IVar8.y | ~uVar4 & (uint)fStack_64) + IVar9.y;
    if (0.0 < local_68) {
      fVar5 = (pIVar2->Style).ItemInnerSpacing.x + local_68;
    }
    bb.Max.x = fVar5 + fVar6;
    bb.Max.y = fVar10 + 0.0;
    (pIVar1->DC).LastItemRect.Min = IVar7;
    (pIVar1->DC).LastItemRect.Max = bb.Max;
    (pIVar2->NextItemData).Flags = 0;
    bb.Min = IVar7;
    local_40.Min = IVar7;
    local_40.Max.x = fVar6;
    local_40.Max.y = fVar10;
    bVar3 = IsRectVisible(&bb.Min,&bb.Max);
    if (bVar3) {
      BeginGroup();
      fStack_84 = IVar7.y;
      if (0.0 < local_68) {
        IVar9.x = (pIVar2->Style).ItemInnerSpacing.x + fVar6;
        IVar9.y = (pIVar2->Style).FramePadding.y + fStack_84;
        RenderText(IVar9,label,(char *)0x0,true);
      }
      local_88 = IVar7.x;
      local_58.x = fVar6 - local_88;
      local_58.y = fVar10 - fStack_84;
      BeginChildFrame(id,&local_58,0);
    }
    else {
      local_58.x = bb.Max.x - bb.Min.x;
      local_58.y = bb.Max.y - bb.Min.y;
      ItemSize(&local_58,(pIVar2->Style).FramePadding.y);
      ItemAdd(&bb,0,&local_40);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.4f + style.ItemSpacing.y);
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    window->DC.LastItemRect = bb; // Forward storage for ListBoxFooter.. dodgy.
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    BeginGroup();
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}